

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QRhiGles2::DeferredReleaseEntry>::erase
          (QPodArrayOps<QRhiGles2::DeferredReleaseEntry> *this,DeferredReleaseEntry *b,qsizetype n)

{
  DeferredReleaseEntry *__src;
  QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *pQVar1;
  DeferredReleaseEntry *pDVar2;
  long in_RDX;
  QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *in_RSI;
  long in_RDI;
  DeferredReleaseEntry *e;
  QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *in_stack_ffffffffffffffb0;
  
  __src = (DeferredReleaseEntry *)((long)&in_RSI->d + in_RDX * 0xc);
  pQVar1 = (QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *)
           QArrayDataPointer<QRhiGles2::DeferredReleaseEntry>::begin
                     ((QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *)0x9436c3);
  if ((in_RSI == pQVar1) &&
     (pDVar2 = QArrayDataPointer<QRhiGles2::DeferredReleaseEntry>::end(in_stack_ffffffffffffffb0),
     __src != pDVar2)) {
    *(DeferredReleaseEntry **)(in_RDI + 8) = __src;
  }
  else {
    pDVar2 = QArrayDataPointer<QRhiGles2::DeferredReleaseEntry>::end(in_stack_ffffffffffffffb0);
    if (__src != pDVar2) {
      pDVar2 = QArrayDataPointer<QRhiGles2::DeferredReleaseEntry>::end(in_RSI);
      memmove(in_RSI,__src,(((long)pDVar2 - (long)__src) / 0xc) * 0xc);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }